

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O1

void tst_layoutnode_horizontal_grid(void)

{
  undefined8 uVar1;
  byte bVar2;
  Node *this;
  Node *child;
  ostream *poVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  RectangleNode *local_78;
  RectangleNode *r [4];
  float local_48;
  float fStack_44;
  
  this = &rengine::LayoutNode::create()->super_Node;
  bVar2 = *(byte *)((long)&this[1].m_next + 4);
  if ((bVar2 & 4) == 0) {
    *(byte *)((long)&this[1].m_next + 4) = bVar2 | 4;
  }
  bVar2 = *(byte *)((long)&this[1].m_next + 4);
  if ((bVar2 & 3) != 0) {
    *(byte *)((long)&this[1].m_next + 4) = bVar2 & 0xfc;
    rengine::Signal<>::emit(&rengine::LayoutNode::onLayoutTypeChanged,&this->super_SignalEmitter);
  }
  lVar4 = 0;
  do {
    child = (Node *)rengine::RectangleNode::create();
    r[lVar4 + -1] = (RectangleNode *)child;
    rengine::Node::append(this,child);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_0010c719:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124758:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124758;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010c719;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0010ca06:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124777:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124777;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010ca06;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0010ccf5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124796:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124796;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 30.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_0010ccf5;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 30.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_0010cfe4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001247b5:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 40.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001247b5;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 40.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010cfe4;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0010d2fc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001247d4:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x90,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001247d4;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010d2fc;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0010d5e2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001247f3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x91,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001247f3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_0010d5e2;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_0010d8d1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124812:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x92,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124812;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010d8d1;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -40.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0010dbc0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -40.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124831:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x93,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124831;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0010dbc0;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0010ded4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00124850:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x95,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124850;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0010ded4;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0010e1ba:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0012486f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x96,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0012486f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0010e1ba;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0010e4a9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012488e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x97,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0012488e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0010e4a9;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -40.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0010e798:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -40.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_001248ad:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x98,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_001248ad;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0010e798;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0010eab0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_001248cc:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_001248cc;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0010eab0;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0010ed9a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_001248eb:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_001248eb;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0010ed9a;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0010f089:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012490a:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0012490a;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 30.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0010f089;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 30.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0010f378:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 30.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124929:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 40.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_00124929;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 40.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0010f378;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_0010f69b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124948:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124948;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0010f69b;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_0010f994:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00124967:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124967;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_0010f994;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 25.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_0010fc8d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 25.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00124986:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 35.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00124986;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 35.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0010fc8d;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 37.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_0010ff86:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 37.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_001249a5:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001249a5;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0010ff86;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001102b2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001249c4:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001249c4;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_001102b2;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_001105ab:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001249e3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_001249e3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001105ab;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -35.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001108a4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -35.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124a02:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124a02;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001108a4;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -47.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00110b9d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -47.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124a21:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -37.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124a21;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -37.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00110b9d;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00110ec9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124a40:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xab,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124a40;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00110ec9;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001111c2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124a5f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xac,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124a5f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001111c2;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -35.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001114bb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -35.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124a7e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xad,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124a7e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -25.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_001114bb;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -47.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_001117b4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -47.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124a9d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xae,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -37.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124a9d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -37.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001117b4;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00111ae0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124abc:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb0,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124abc;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00111ae0;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00111dd9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124adb:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124adb;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00111dd9;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 25.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_001120d2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 25.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124afa:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 35.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124afa;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 35.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001120d2;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 37.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001123cb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 37.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124b19:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124b19;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001123cb;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001126f3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124b38:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124b38;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001126f3;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001129e0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124b57:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124b57;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001129e0;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00112ccf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124b76:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124b76;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00112ccf;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00112fbe:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124b95:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xba,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 40.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124b95;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 40.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00112fbe;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001132df:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124bb4:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124bb4;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001132df;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001135c5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124bd3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124bd3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001135c5;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001138b4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124bf2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124bf2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001138b4;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -40.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00113ba3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -40.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124c11:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124c11;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00113ba3;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00113ec0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124c30:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124c30;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00113ec0;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_001141a6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124c4f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124c4f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_001141a6;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00114495:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -30.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124c6e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_00124c6e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00114495;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -40.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00114784:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -40.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124c8d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124c8d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00114784;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00114aa5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00124cac:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124cac;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_00114aa5;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00114d8f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00124ccb:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,199,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_00124ccb;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00114d8f;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011507e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00124cea:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,200,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124cea;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0011507e;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011536d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 30.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00124d09:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 40.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00124d09;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 40.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0011536d;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00115699:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00124d28:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcd,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00124d28;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00115699;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00115992:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124d47:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xce,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124d47;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00115992;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 25.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00115c8b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 25.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124d66:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 35.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124d66;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 35.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00115c8b;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 37.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00115f84:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 37.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124d85:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 47.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00124d85;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00115f84;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001162b6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124da4:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd2,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124da4;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001162b6;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001165af:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00124dc3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124dc3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_001165af;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -35.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_001168a8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -35.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00124de2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -25.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00124de2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001168a8;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -47.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00116ba1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -47.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00124e01:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -37.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00124e01;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -37.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00116ba1;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00116ed3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124e20:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124e20;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00116ed3;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_001171cc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124e3f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124e3f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001171cc;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -35.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001174c5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -35.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124e5e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124e5e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -25.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001174c5;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -47.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001177be:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -47.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124e7d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xda,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -37.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124e7d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -37.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_001177be;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00117af0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124e9c:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124e9c;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00117af0;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00117de9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00124ebb:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124ebb;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00117de9;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 25.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001180e2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 25.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124eda:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xde,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 35.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00124eda;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 35.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_001180e2;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 37.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_001183db:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 37.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00124ef9:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 47.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00124ef9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 47.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001183db;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00118700:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124f18:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe5,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124f18;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00118700;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001189ed:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00124f37:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124f37;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001189ed;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_00118cdc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00124f56:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 40.0)) || (NAN(fVar6))) goto LAB_00124f56;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00118cdc;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00118fd0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_00124f75:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00124f75;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00118fd0;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_001192f4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124f94:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xea,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00124f94;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001192f4;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001195da:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00124fb3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xeb,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_00124fb3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_001195da;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_001198c9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_00124fd2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xec,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00124fd2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_001198c9;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00119bbc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00124ff1:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xed,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00124ff1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 40.0)) || (NAN(fVar6))) goto LAB_00119bbc;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00119edc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00125010:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xef,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_00125010;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00119edc;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011a1c2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012502f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0012502f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0011a1c2;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_0011a4b1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_0012504e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0012504e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_0011a4b1;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_0011a7a4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_0012506d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_0012506d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0011a7a4;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011aac8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012508c:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf4,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0012508c;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0011aac8;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011adb2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_001250ab:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_001250ab;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0011adb2;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_0011b0a1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_001250ca:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_001250ca;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0011b0a1;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_0011b395:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_001250e9:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_001250e9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0011b395;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_0011b6c4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00125108:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfb,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00125108;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_0011b6c4;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_0011b9bd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00125127:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfc,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00125127;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0011b9bd;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_0011bcb6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_00125146:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00125146;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_0011bcb6;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_0011bfaf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_00125165:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00125165;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != 43.0)) || (NAN(fVar6))) goto LAB_0011bfaf;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_0011c2de:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00125184:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x100,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00125184;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0011c2de;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_0011c5d7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_001251a3:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x101,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001251a3;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0011c5d7;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_0011c8d0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_001251c2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x102,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_001251c2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != 43.0)) || (NAN(fVar6))) goto LAB_0011c8d0;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_0011cbc9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_001251e1:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x103,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != 43.0)) || (NAN(fVar6))) goto LAB_001251e1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_0011cbc9;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0011cef8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00125200:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x105,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00125200;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0011cef8;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0011d1f1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0012521f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x106,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0012521f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_0011d1f1;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0011d4ea:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_0012523e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x107,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != -23.0)) || (NAN(fVar6))) goto LAB_0012523e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0011d4ea;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_0011d7e3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0012525d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x108,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0012525d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0011d7e3;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0011db12:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0012527c:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0012527c;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_0011db12;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_0011de0b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0012529b:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_0012529b;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0011de0b;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_0011e104:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_001252ba:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_001252ba;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0011e104;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_0011e3fd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_001252d9:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_001252d9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != -23.0)) || (NAN(fVar6))) goto LAB_0011e3fd;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_0011e725:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_001252f8:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x111,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_001252f8;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0011e725;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0011ea12:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00125317:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x112,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00125317;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0011ea12;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_0011ed01:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00125336:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x113,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_00125336;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 40.0)) || (NAN(fVar6))) goto LAB_0011ed01;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_0011eff5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_00125355:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x114,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != 40.0)) || (NAN(fVar6))) goto LAB_00125355;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_0011eff5;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0011f31c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
LAB_00125374:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x116,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00125374;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_0011f31c;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_0011f602:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) {
LAB_00125393:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x117,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) goto LAB_00125393;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) goto LAB_0011f602;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_0011f8f1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_001253b2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x118,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 40.0)) || (NAN(fVar6))) goto LAB_001253b2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_0011f8f1;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != 20.0 || (NAN(fVar6))))) {
LAB_0011fbe4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != 20.0)) || (NAN(fVar6))) {
LAB_001253d1:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x119,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_001253d1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 40.0 || (NAN(fVar6))))) goto LAB_0011fbe4;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0011ff07:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_001253f0:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_001253f0;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0011ff07;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_001201ed:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012540f:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0012540f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_001201ed;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_001204dc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_0012542e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0012542e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_001204dc;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_001207cf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -20.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_0012544d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_0012544d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_001207cf;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_00120af6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_0012546c:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x120,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != 0.0)) || (NAN(fVar6))) goto LAB_0012546c;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00120af6;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) {
LAB_00120de0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) {
LAB_0012548b:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x121,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_0012548b;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != 0.0 || (NAN(fVar6))))) goto LAB_00120de0;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_001210cf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 0.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_001254aa:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x122,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_001254aa;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_001210cf;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 10.0) || (NAN(fVar5))) || (fVar6 != -40.0)) || (NAN(fVar6))) {
LAB_001213c3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 10.0) || (NAN(fVar5))) || ((fVar6 != -40.0 || (NAN(fVar6))))) {
LAB_001254c9:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x123,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 20.0) || (NAN(fVar5))) || (fVar6 != -20.0)) || (NAN(fVar6))) goto LAB_001254c9;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 20.0) || (NAN(fVar5))) || ((fVar6 != -20.0 || (NAN(fVar6))))) goto LAB_001213c3;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001216f5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_001254e8:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x127,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001254e8;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_001216f5;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_001219ee:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_00125507:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x128,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00125507;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_001219ee;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_00121ce7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_00125526:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x129,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != 43.0)) || (NAN(fVar6))) goto LAB_00125526;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00121ce7;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_00121fe0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 13.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_00125545:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12a,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00125545;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00121fe0;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00122312:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00125564:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,300,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_00125564;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00122312;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != 1.0)) || (NAN(fVar6))) {
LAB_0012260b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 1.0 || (NAN(fVar6))))) {
LAB_00125583:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != 21.0)) || (NAN(fVar6))) goto LAB_00125583;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 21.0 || (NAN(fVar6))))) goto LAB_0012260b;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_00122904:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != 23.0)) || (NAN(fVar6))) {
LAB_001255a2:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_001255a2;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_00122904;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_00122bfd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != 23.0 || (NAN(fVar6))))) {
LAB_001255c1:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12f,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != 43.0 || (NAN(fVar6))))) goto LAB_001255c1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != 43.0)) || (NAN(fVar6))) goto LAB_00122bfd;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_00122f2f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_001255e0:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x131,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_001255e0;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00122f2f;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -23.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00123228:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_001255ff:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x132,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_001255ff;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00123228;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != -11.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_00123521:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -11.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0012561e:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x133,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -1.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0012561e;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -1.0) || (NAN(fVar5))) || (fVar6 != -23.0)) || (NAN(fVar6))) goto LAB_00123521;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0012381a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -23.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0012563d:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x134,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != -13.0) || (NAN(fVar5))) || (fVar6 != -23.0)) || (NAN(fVar6))) goto LAB_0012563d;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != -13.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0012381a;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
  fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
  if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00123b4c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_78 + 0x34);
    r[3] = *(RectangleNode **)((long)local_78 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x34);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x34) >> 0x20);
    if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -21.0)) || (NAN(fVar6))) {
LAB_0012565c:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x136,"void tst_layoutnode_horizontal_grid()");
    }
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0012565c;
  }
  else {
    fVar5 = (float)*(undefined8 *)((long)local_78 + 0x3c);
    fVar6 = (float)((ulong)*(undefined8 *)((long)local_78 + 0x3c) >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_00123b4c;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_00123e45:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 13.0) || (NAN(fVar5))) || ((fVar6 != -21.0 || (NAN(fVar6))))) {
LAB_0012567b:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x137,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 23.0) || (NAN(fVar5))) || ((fVar6 != -1.0 || (NAN(fVar6))))) goto LAB_0012567b;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 23.0) || (NAN(fVar5))) || (fVar6 != -1.0)) || (NAN(fVar6))) goto LAB_00123e45;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 != 1.0) || (NAN(fVar5))) || (fVar6 != -43.0)) || (NAN(fVar6))) {
LAB_0012413e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    r[3] = *(RectangleNode **)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar3 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar3 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 1.0) || (NAN(fVar5))) || ((fVar6 != -43.0 || (NAN(fVar6))))) {
LAB_0012569a:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x138,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar5 != 11.0) || (NAN(fVar5))) || (fVar6 != -23.0)) || (NAN(fVar6))) goto LAB_0012569a;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 != 11.0) || (NAN(fVar5))) || ((fVar6 != -23.0 || (NAN(fVar6))))) goto LAB_0012413e;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar5 == 13.0) && (!NAN(fVar5))) && ((fVar6 == -43.0 && (!NAN(fVar6))))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 == 23.0) && (!NAN(fVar5))) && ((fVar6 == -23.0 && (!NAN(fVar6)))))
    goto LAB_001246ea;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  r[3] = *(RectangleNode **)&(r[2]->super_RectangleNodeBase).field_0x3c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  local_48 = (float)uVar1;
  poVar3 = std::ostream::_M_insert<double>((double)local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  fStack_44 = (float)((ulong)uVar1 >> 0x20);
  poVar3 = std::ostream::_M_insert<double>((double)fStack_44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  poVar3 = std::ostream::_M_insert<double>((double)r[3]._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>((double)r[3]._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  poVar3 = std::ostream::_M_insert<double>(13.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>(-43.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  poVar3 = std::ostream::_M_insert<double>(23.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>(-23.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar5 = (float)uVar1;
  fVar6 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar5 == 13.0) && (!NAN(fVar5))) && (fVar6 == -43.0)) && (!NAN(fVar6))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar5 = (float)uVar1;
    fVar6 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar5 == 23.0) && (!NAN(fVar5))) && ((fVar6 == -23.0 && (!NAN(fVar6))))) {
LAB_001246ea:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"void tst_layoutnode_horizontal_grid()",0x25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      (*(this->super_SignalEmitter)._vptr_SignalEmitter[2])();
      return;
    }
  }
  __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                ,0x139,"void tst_layoutnode_horizontal_grid()");
}

Assistant:

void tst_layoutnode_horizontal_grid()
{
    LayoutNode *root = LayoutNode::create();
    root->setActivationMode(LayoutNode::Explicit);
    root->setLayoutType(LayoutEngine::Grid_Horizontal);

    RectangleNode *r[4];
    for (int i=0; i<4; ++i) {
        r[i] = RectangleNode::create();
        root->append(r[i]);
    }

    // cellsize, one row
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // cellsize, margin/spacing
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // width/height, 1x4 grid
    apply_w_h_cw_ch_r_c_m_s(root, 40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // width/height, 1x4 grid, space/margin
    apply_w_h_cw_ch_r_c_m_s(root, 48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // And then all the same tests, but this time limited to 2 columns

    // cell size, 2 columns
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // cell size, space/margin, 2 cols
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));


    cout << __PRETTY_FUNCTION__ << ": ok" << endl;

    root->destroy();
}